

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O0

sexp sexp_bignum_shift(sexp ctx,sexp a,sexp_uint_t k)

{
  sexp_uint_t len;
  sexp psVar1;
  long in_RDX;
  sexp in_RSI;
  sexp_uint_t i;
  sexp_uint_t alen;
  sexp res;
  ulong local_30;
  sexp in_stack_ffffffffffffffe0;
  
  len = sexp_bignum_hi(in_RSI);
  psVar1 = sexp_make_bignum(in_stack_ffffffffffffffe0,len);
  for (local_30 = 0; local_30 < len; local_30 = local_30 + 1) {
    *(undefined8 *)((long)&psVar1->value + (local_30 + in_RDX) * 8 + 0x10) =
         *(undefined8 *)((long)&in_RSI->value + local_30 * 8 + 0x10);
  }
  return psVar1;
}

Assistant:

static sexp sexp_bignum_shift (sexp ctx, sexp a, sexp_uint_t k) {
  sexp res;
  sexp_uint_t alen = sexp_bignum_hi(a), i;
  res = sexp_make_bignum(ctx, alen + k + 1);
  for (i=0; i<alen; i++)
    sexp_bignum_data(res)[i+k] = sexp_bignum_data(a)[i];
  return res;
}